

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O1

Gia_Man_t * Bmc_CexBuildNetwork(Gia_Man_t *p,Abc_Cex_t *pCex)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Gia_Man_t *p_00;
  char *pcVar9;
  Vec_Int_t *pVVar10;
  Gia_Obj_t *pGVar11;
  Gia_Man_t *pGVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  uint local_4c;
  
  local_4c = pCex->nRegs;
  p_00 = Gia_ManStart(1000);
  pcVar9 = (char *)malloc(6);
  builtin_strncpy(pcVar9,"unate",6);
  p_00->pName = pcVar9;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xffffffffbfffffff;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs | 0x4000000000000000;
  p->pObjs->Value = 0xffffffff;
  iVar13 = p->nRegs;
  if (0 < iVar13) {
    iVar6 = 0;
    do {
      iVar7 = p->vCos->nSize;
      uVar18 = (iVar7 - iVar13) + iVar6;
      if (((int)uVar18 < 0) || (iVar7 <= (int)uVar18)) goto LAB_0057c613;
      iVar13 = p->vCos->pArray[uVar18];
      lVar15 = (long)iVar13;
      if ((lVar15 < 0) || (p->nObjs <= iVar13)) goto LAB_0057c5d5;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      *(ulong *)(pGVar3 + lVar15) =
           *(ulong *)(pGVar3 + lVar15) & 0xbfffffffbfffffff | 0x4000000000000000;
      pGVar3[lVar15].Value = 0xffffffff;
      iVar6 = iVar6 + 1;
      iVar13 = p->nRegs;
    } while (iVar6 < iVar13);
  }
  Gia_ManHashAlloc(p_00);
  if (-1 < pCex->iFrame) {
    iVar13 = 0;
    do {
      pVVar10 = p->vCis;
      uVar16 = (ulong)(uint)pVVar10->nSize;
      if (p->nRegs < pVVar10->nSize) {
        lVar15 = 0;
        do {
          if ((int)uVar16 <= lVar15) goto LAB_0057c613;
          iVar6 = pVVar10->pArray[lVar15];
          if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_0057c5d5;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar3 = p->pObjs + iVar6;
          *(ulong *)pGVar3 =
               *(ulong *)pGVar3 & 0xbfffffffbfffffff |
               (ulong)(((uint)(&pCex[1].iPo)[(int)((ulong)local_4c + lVar15) >> 5] >>
                        ((byte)((ulong)local_4c + lVar15) & 0x1f) & 1) << 0x1e);
          pGVar11 = Gia_ManAppendObj(p_00);
          uVar16 = *(ulong *)pGVar11;
          *(ulong *)pGVar11 = uVar16 | 0x9fffffff;
          *(ulong *)pGVar11 =
               uVar16 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar4 = p_00->pObjs;
          if ((pGVar11 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar11)) {
LAB_0057c5f4:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar4) >> 2) * -0x55555555);
          pGVar4 = p_00->pObjs;
          if ((pGVar11 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar11)) goto LAB_0057c5f4;
          pGVar3->Value = (int)((ulong)((long)pGVar11 - (long)pGVar4) >> 2) * 0x55555556;
          lVar15 = lVar15 + 1;
          pVVar10 = p->vCis;
          uVar16 = (ulong)pVVar10->nSize;
        } while (lVar15 < (long)(uVar16 - (long)p->nRegs));
        local_4c = local_4c + (int)lVar15;
      }
      iVar6 = p->nRegs;
      if (0 < iVar6) {
        iVar7 = 0;
        do {
          iVar1 = p->vCos->nSize;
          uVar18 = (iVar1 - iVar6) + iVar7;
          if (((int)uVar18 < 0) || (iVar1 <= (int)uVar18)) goto LAB_0057c613;
          iVar1 = p->vCos->pArray[uVar18];
          if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0057c5d5;
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          iVar2 = p->vCis->nSize;
          uVar18 = (iVar2 - iVar6) + iVar7;
          if (((int)uVar18 < 0) || (iVar2 <= (int)uVar18)) goto LAB_0057c613;
          iVar6 = p->vCis->pArray[uVar18];
          lVar15 = (long)iVar6;
          if ((lVar15 < 0) || (p->nObjs <= iVar6)) goto LAB_0057c5d5;
          pGVar4 = pGVar3 + iVar1;
          uVar16 = *(ulong *)pGVar4;
          uVar22 = *(ulong *)(pGVar3 + lVar15);
          *(ulong *)(pGVar3 + lVar15) = uVar22 & 0xffffffffbfffffff | uVar16 & 0x40000000;
          *(ulong *)(pGVar3 + lVar15) =
               uVar22 & 0xbfffffffbfffffff | uVar16 & 0x40000000 |
               *(ulong *)pGVar4 & 0x4000000000000000;
          pGVar3[lVar15].Value = pGVar4->Value;
          iVar7 = iVar7 + 1;
          iVar6 = p->nRegs;
        } while (iVar7 < iVar6);
      }
      if (0 < p->nObjs) {
        lVar15 = 0;
        lVar25 = 0;
        do {
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          uVar16 = *(ulong *)(&pGVar3->field_0x0 + lVar15);
          uVar18 = (uint)uVar16;
          if ((uVar16 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar18) {
            uVar21 = *(uint *)((long)pGVar3 +
                              (ulong)(uint)((int)(uVar16 & 0x1fffffff) << 2) * -3 + lVar15) >> 0x1e;
            uVar8 = uVar21 & 1;
            uVar24 = (uint)(uVar16 >> 0x1d);
            uVar14 = uVar24 & 1;
            uVar23 = (uint)(uVar16 >> 0x1e);
            uVar17 = *(uint *)((long)pGVar3 + (ulong)(uVar23 & 0x7ffffffc) * -3 + lVar15) >> 0x1e &
                     1;
            uVar19 = (uint)(uVar16 >> 0x3d) & 1;
            uVar24 = (uVar17 ^ uVar19) & (uVar21 ^ uVar24 & 7);
            uVar22 = (ulong)(uVar24 << 0x1e);
            *(ulong *)(&pGVar3->field_0x0 + lVar15) = uVar16 & 0xffffffff3fffffff | uVar22;
            if (uVar24 == 0) {
              if ((uVar8 == uVar14) && (uVar17 == uVar19)) {
                uVar22 = *(ulong *)((long)pGVar3 + lVar15 + (ulong)(uVar23 & 0x7ffffffc) * -3) |
                         *(ulong *)((long)pGVar3 + lVar15 + (ulong)((uVar18 & 0x1fffffff) << 2) * -3
                                   );
              }
              else {
                if (uVar8 == uVar14) {
                  uVar23 = (uVar18 & 0x1fffffff) << 2;
                }
                else {
                  if (uVar17 != uVar19) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                                  ,0xf6,"Gia_Man_t *Bmc_CexBuildNetwork(Gia_Man_t *, Abc_Cex_t *)");
                  }
                  uVar23 = uVar23 & 0x7ffffffc;
                }
                uVar22 = *(ulong *)((long)pGVar3 + lVar15 + (ulong)uVar23 * -3);
              }
              uVar16 = uVar16 & 0xbfffffff3fffffff | uVar22 & 0x4000000000000000;
            }
            else {
              uVar16 = uVar16 & 0xbfffffff3fffffff | uVar22 |
                       *(ulong *)((long)pGVar3 + lVar15 + (ulong)((uVar18 & 0x1fffffff) << 2) * -3)
                       & 0x4000000000000000 &
                       *(ulong *)((long)pGVar3 + lVar15 + (ulong)(uVar23 & 0x7ffffffc) * -3);
            }
            *(ulong *)(&pGVar3->field_0x0 + lVar15) = uVar16;
            *(undefined4 *)((long)&pGVar3->Value + lVar15) = 0xffffffff;
            if ((uVar16 & 0x4000000000000000) == 0) {
              uVar18 = (uint)uVar16;
              if (uVar18 >> 0x1e == 0) {
                if ((uVar8 == uVar14) && (uVar17 == uVar19)) {
                  iVar6 = Gia_ManHashOr(p_00,*(int *)((long)pGVar3 +
                                                     lVar15 + 8 +
                                                     (ulong)((uVar18 & 0x1fffffff) << 2) * -3),
                                        *(int *)((long)pGVar3 +
                                                lVar15 + 8 +
                                                (ulong)((uint)(uVar16 >> 0x1e) & 0x7ffffffc) * -3));
                }
                else {
                  if (uVar8 == uVar14) {
                    uVar18 = (uVar18 & 0x1fffffff) << 2;
                  }
                  else {
                    if (uVar17 != uVar19) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                                    ,0x102,
                                    "Gia_Man_t *Bmc_CexBuildNetwork(Gia_Man_t *, Abc_Cex_t *)");
                    }
                    uVar18 = (uint)(uVar16 >> 0x1e) & 0x7ffffffc;
                  }
                  iVar6 = *(int *)((long)pGVar3 + lVar15 + (ulong)uVar18 * -3 + 8);
                }
              }
              else {
                iVar6 = Gia_ManHashAnd(p_00,*(int *)((long)pGVar3 +
                                                    lVar15 + 8 +
                                                    (ulong)((uVar18 & 0x1fffffff) << 2) * -3),
                                       *(int *)((long)pGVar3 +
                                               lVar15 + 8 +
                                               (ulong)((uint)(uVar16 >> 0x1e) & 0x7ffffffc) * -3));
              }
              *(int *)((long)&pGVar3->Value + lVar15) = iVar6;
              if (iVar6 == 0) {
                __assert_fail("pObj->Value > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                              ,0x103,"Gia_Man_t *Bmc_CexBuildNetwork(Gia_Man_t *, Abc_Cex_t *)");
              }
            }
          }
          lVar25 = lVar25 + 1;
          lVar15 = lVar15 + 0xc;
        } while (lVar25 < p->nObjs);
      }
      pVVar10 = p->vCos;
      if (0 < pVVar10->nSize) {
        lVar15 = 0;
        do {
          iVar6 = pVVar10->pArray[lVar15];
          if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_0057c5d5;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar3 = p->pObjs + iVar6;
          uVar16 = *(ulong *)pGVar3;
          uVar22 = (ulong)((uint)uVar16 & 0x1fffffff);
          uVar20 = (ulong)(((uint)uVar16 * 2 ^ *(uint *)(pGVar3 + -uVar22)) & 0x40000000);
          *(ulong *)pGVar3 = uVar16 & 0xffffffffbfffffff | uVar20;
          *(ulong *)pGVar3 =
               uVar16 & 0xbfffffffbfffffff | uVar20 |
               *(ulong *)(pGVar3 + -uVar22) & 0x4000000000000000;
          pGVar3->Value = pGVar3[-uVar22].Value;
          lVar15 = lVar15 + 1;
          pVVar10 = p->vCos;
        } while (lVar15 < pVVar10->nSize);
      }
      bVar5 = iVar13 < pCex->iFrame;
      iVar13 = iVar13 + 1;
    } while (bVar5);
  }
  Gia_ManHashStop(p_00);
  if (local_4c != pCex->nBits) {
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                  ,0x10e,"Gia_Man_t *Bmc_CexBuildNetwork(Gia_Man_t *, Abc_Cex_t *)");
  }
  uVar18 = pCex->iPo;
  iVar13 = p->vCos->nSize;
  if (iVar13 - p->nRegs <= (int)uVar18) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if ((-1 < (int)uVar18) && ((int)uVar18 < iVar13)) {
    iVar13 = p->vCos->pArray[uVar18];
    lVar15 = (long)iVar13;
    if ((-1 < lVar15) && (iVar13 < p->nObjs)) {
      uVar16 = *(ulong *)(p->pObjs + lVar15);
      if (((uint)uVar16 >> 0x1e & 1) == 0) {
        __assert_fail("pObj->fMark0 == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                      ,0x111,"Gia_Man_t *Bmc_CexBuildNetwork(Gia_Man_t *, Abc_Cex_t *)");
      }
      if ((uVar16 & 0x4000000000000000) == 0) {
        uVar18 = p->pObjs[lVar15].Value;
        if (uVar18 != 0) {
          Gia_ManAppendCo(p_00,uVar18);
          pGVar12 = Gia_ManCleanup(p_00);
          Gia_ManStop(p_00);
          return pGVar12;
        }
        __assert_fail("pObj->Value > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                      ,0x113,"Gia_Man_t *Bmc_CexBuildNetwork(Gia_Man_t *, Abc_Cex_t *)");
      }
      __assert_fail("pObj->fMark1 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                    ,0x112,"Gia_Man_t *Bmc_CexBuildNetwork(Gia_Man_t *, Abc_Cex_t *)");
    }
LAB_0057c5d5:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
LAB_0057c613:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Gia_Man_t * Bmc_CexBuildNetwork( Gia_Man_t * p, Abc_Cex_t * pCex )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int fCompl0, fCompl1;
    int i, k, iBit = pCex->nRegs;
    // start the manager
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( "unate" );
    // set const0
    Gia_ManConst0(p)->fMark0 = 0;
    Gia_ManConst0(p)->fMark1 = 1;
    Gia_ManConst0(p)->Value  = ~0;
    // set init state
    Gia_ManForEachRi( p, pObj, k )
    {
        pObj->fMark0 = 0;
        pObj->fMark1 = 1;
        pObj->Value  = ~0;
    }
    Gia_ManHashAlloc( pNew );
    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        //  primary inputs
        Gia_ManForEachPi( p, pObj, k )
        {
            pObj->fMark0 = Abc_InfoHasBit( pCex->pData, iBit++ );
            pObj->fMark1 = 0;
            pObj->Value  = Gia_ManAppendCi(pNew);
        }
        // transfer 
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
        {
            pObjRo->fMark0 = pObjRi->fMark0;
            pObjRo->fMark1 = pObjRi->fMark1;
            pObjRo->Value  = pObjRi->Value;
        }
        // internal nodes
        Gia_ManForEachAnd( p, pObj, k )
        {
            fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
            pObj->fMark0 = fCompl0 & fCompl1;
            if ( pObj->fMark0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 & Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 && !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 | Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
            else if ( !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin1(pObj)->fMark1;
            else assert( 0 );
            pObj->Value = ~0;
            if ( pObj->fMark1 )
                continue;
            if ( pObj->fMark0 )
                pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
            else if ( !fCompl0 && !fCompl1 )
                pObj->Value = Gia_ManHashOr( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
            else if ( !fCompl0 )
                pObj->Value = Gia_ObjFanin0(pObj)->Value;
            else if ( !fCompl1 )
                pObj->Value = Gia_ObjFanin1(pObj)->Value;
            else assert( 0 );
            assert( pObj->Value > 0 );
        }
        // combinational outputs
        Gia_ManForEachCo( p, pObj, k )
        {
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
            pObj->Value  = Gia_ObjFanin0(pObj)->Value;
        }
    }
    Gia_ManHashStop( pNew );
    assert( iBit == pCex->nBits );
    // create primary output
    pObj = Gia_ManPo(p, pCex->iPo);
    assert( pObj->fMark0 == 1 );
    assert( pObj->fMark1 == 0 );
    assert( pObj->Value > 0 );
    Gia_ManAppendCo( pNew, pObj->Value );
    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}